

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O2

void __thiscall ASDCP::MXF::Track::Dump(Track *this,FILE *stream)

{
  char *pcVar1;
  char identbuf [128];
  char local_a8 [136];
  
  local_a8[0] = '\0';
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stderr;
  }
  GenericTrack::Dump(&this->super_GenericTrack,stream);
  pcVar1 = Rational::EncodeString(&this->EditRate,local_a8,0x80);
  fprintf((FILE *)stream,"  %22s = %s\n","EditRate",pcVar1);
  pcVar1 = i64sz(this->Origin,local_a8);
  fprintf((FILE *)stream,"  %22s = %s\n","Origin",pcVar1);
  return;
}

Assistant:

void
Track::Dump(FILE* stream)
{
  char identbuf[IdentBufferLen];
  *identbuf = 0;

  if ( stream == 0 )
    stream = stderr;

  GenericTrack::Dump(stream);
  fprintf(stream, "  %22s = %s\n",  "EditRate", EditRate.EncodeString(identbuf, IdentBufferLen));
  fprintf(stream, "  %22s = %s\n",  "Origin", i64sz(Origin, identbuf));
}